

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O0

ChannelPtr __thiscall cali::ConfigManager::get_channel(ConfigManager *this,char *name)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ChannelPtr CVar3;
  string local_60;
  __shared_ptr_access<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_40;
  ChannelPtr *chn;
  iterator __end1;
  iterator __begin1;
  ChannelList *__range1;
  char *name_local;
  ConfigManager *this_local;
  
  this_00 = std::
            __shared_ptr_access<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)name);
  __end1 = std::
           vector<std::shared_ptr<cali::ChannelController>,_std::allocator<std::shared_ptr<cali::ChannelController>_>_>
           ::begin(&this_00->m_channels);
  chn = (ChannelPtr *)
        std::
        vector<std::shared_ptr<cali::ChannelController>,_std::allocator<std::shared_ptr<cali::ChannelController>_>_>
        ::end(&this_00->m_channels);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<cali::ChannelController>_*,_std::vector<std::shared_ptr<cali::ChannelController>,_std::allocator<std::shared_ptr<cali::ChannelController>_>_>_>
                                *)&chn);
    if (!bVar1) {
      std::shared_ptr<cali::ChannelController>::shared_ptr
                ((shared_ptr<cali::ChannelController> *)this);
      _Var2._M_pi = extraout_RDX_00;
LAB_004012ee:
      CVar3.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      CVar3.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ChannelPtr)
             CVar3.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_40 = (__shared_ptr_access<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<cali::ChannelController>_*,_std::vector<std::shared_ptr<cali::ChannelController>,_std::allocator<std::shared_ptr<cali::ChannelController>_>_>_>
                  ::operator*(&__end1);
    this_01 = std::
              __shared_ptr_access<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(local_40);
    ChannelController::name_abi_cxx11_(&local_60,this_01);
    bVar1 = std::operator==(&local_60,in_RDX);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::shared_ptr<cali::ChannelController>::shared_ptr
                ((shared_ptr<cali::ChannelController> *)this,
                 (shared_ptr<cali::ChannelController> *)local_40);
      _Var2._M_pi = extraout_RDX;
      goto LAB_004012ee;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<cali::ChannelController>_*,_std::vector<std::shared_ptr<cali::ChannelController>,_std::allocator<std::shared_ptr<cali::ChannelController>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

ConfigManager::ChannelPtr ConfigManager::get_channel(const char* name) const
{
    for (ChannelPtr& chn : mP->m_channels)
        if (chn->name() == name)
            return chn;

    return ChannelPtr();
}